

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall
glslang::TPpContext::evalToToken
          (TPpContext *this,int token,bool shortCircuit,int *res,bool *err,TPpToken *ppToken)

{
  TParseContextBase *pTVar1;
  _func_int **pp_Var2;
  int iVar3;
  MacroExpandResult MVar4;
  
  if (token == 0xa2) {
    while (iVar3 = strcmp("defined",ppToken->name), iVar3 != 0) {
      MVar4 = MacroExpand(this,ppToken,true,false);
      if (MVar4 < MacroExpandStarted) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"can\'t evaluate expression","preprocessor evaluation"
                   ,"");
        *err = true;
        *res = 0;
      }
      else if (((MVar4 == MacroExpandUndef) && (!shortCircuit)) &&
              (pTVar1 = this->parseContext, (pTVar1->super_TParseVersions).profile == EEsProfile)) {
        pp_Var2 = (pTVar1->super_TParseVersions)._vptr_TParseVersions;
        if (((pTVar1->super_TParseVersions).messages & EShMsgRelaxedErrors) == EShMsgDefault) {
          (*pp_Var2[0x2f])();
        }
        else {
          (*pp_Var2[0x30])(pTVar1,ppToken,"undefined macro in expression not allowed in es profile",
                           "preprocessor evaluation",ppToken->name);
        }
      }
      iVar3 = scanToken(this,ppToken);
      if (iVar3 != 0xa2) {
        return iVar3;
      }
      if (*err != false) {
        return 0xa2;
      }
    }
    token = 0xa2;
  }
  return token;
}

Assistant:

int TPpContext::evalToToken(int token, bool shortCircuit, int& res, bool& err, TPpToken* ppToken)
{
    while (token == PpAtomIdentifier && strcmp("defined", ppToken->name) != 0) {
        switch (MacroExpand(ppToken, true, false)) {
        case MacroExpandNotStarted:
        case MacroExpandError:
            parseContext.ppError(ppToken->loc, "can't evaluate expression", "preprocessor evaluation", "");
            err = true;
            res = 0;
            break;
        case MacroExpandStarted:
            break;
        case MacroExpandUndef:
            if (! shortCircuit && parseContext.isEsProfile()) {
                const char* message = "undefined macro in expression not allowed in es profile";
                if (parseContext.relaxedErrors())
                    parseContext.ppWarn(ppToken->loc, message, "preprocessor evaluation", ppToken->name);
                else
                    parseContext.ppError(ppToken->loc, message, "preprocessor evaluation", ppToken->name);
            }
            break;
        }
        token = scanToken(ppToken);
        if (err)
            break;
    }

    return token;
}